

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

shared_ptr<mir::inst::PhiInst> ir_phi(VarId *var,int n)

{
  PhiInst *this;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar1;
  undefined4 in_register_00000034;
  bool bVar2;
  shared_ptr<mir::inst::PhiInst> sVar3;
  VarId local_68;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> vars;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_38;
  
  vars.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vars.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vars.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = 0;
  if (0 < in_EDX) {
    iVar1 = in_EDX;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
              (&vars,(value_type *)CONCAT44(in_register_00000034,n));
  }
  this = (PhiInst *)operator_new(0x40);
  local_68.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_68.id = ((value_type *)CONCAT44(in_register_00000034,n))->id;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_38,&vars);
  mir::inst::PhiInst::PhiInst
            (this,&local_68,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_38
            );
  std::__shared_ptr<mir::inst::PhiInst,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::PhiInst,void>
            ((__shared_ptr<mir::inst::PhiInst,(__gnu_cxx::_Lock_policy)2> *)var,this);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_38);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
            (&vars.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>);
  sVar3.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)var;
  return (shared_ptr<mir::inst::PhiInst>)
         sVar3.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<mir::inst::PhiInst> ir_phi(mir::inst::VarId var, int n) {
  vector<mir::inst::VarId> vars;
  for (int i = 0; i < n; i++) {
    vars.push_back(var);
  }
  return shared_ptr<mir::inst::PhiInst>(new mir::inst::PhiInst(var, vars));
}